

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void tcg_prologue_init_arm(TCGContext_conflict *s)

{
  tcg_insn_unit *start;
  tcg_insn_unit *stop;
  size_t sVar1;
  size_t sVar2;
  int result;
  void *buf1;
  void *buf0;
  size_t total_size;
  size_t prologue_size;
  TCGContext_conflict *s_local;
  
  start = (tcg_insn_unit *)s->code_gen_buffer;
  sVar2 = s->code_gen_buffer_size;
  s->code_ptr = start;
  s->code_buf = start;
  s->data_gen_ptr = (void *)0x0;
  s->code_gen_prologue = start;
  s->code_gen_highwater =
       (void *)((long)s->code_gen_buffer + ((sVar2 - 0x400) - s->uc->qemu_real_host_page_size));
  s->pool_labels = (TCGLabelPoolData *)0x0;
  tcg_target_qemu_prologue(s);
  tcg_out_pool_finalize(s);
  stop = s->code_ptr;
  flush_icache_range_arm((uintptr_t)start,(uintptr_t)stop);
  sVar1 = tcg_current_code_size(s);
  s->code_gen_ptr = stop;
  s->code_gen_buffer = stop;
  s->code_buf = stop;
  sVar2 = sVar2 - sVar1;
  s->code_gen_buffer_size = sVar2;
  tcg_register_jit_arm(s,s->code_gen_buffer,sVar2);
  return;
}

Assistant:

void tcg_prologue_init(TCGContext *s)
{
    size_t prologue_size, total_size;
    void *buf0, *buf1;

    /* Put the prologue at the beginning of code_gen_buffer.  */
    buf0 = s->code_gen_buffer;
    total_size = s->code_gen_buffer_size;
    s->code_ptr = buf0;
    s->code_buf = buf0;
    s->data_gen_ptr = NULL;
    s->code_gen_prologue = buf0;

    /* Compute a high-water mark, at which we voluntarily flush the buffer
       and start over.  The size here is arbitrary, significantly larger
       than we expect the code generation for any one opcode to require.  */
    s->code_gen_highwater = (char *)s->code_gen_buffer + (total_size - TCG_HIGHWATER) - s->uc->qemu_real_host_page_size;

#ifdef TCG_TARGET_NEED_POOL_LABELS
    s->pool_labels = NULL;
#endif

    /* Generate the prologue.  */
    tcg_target_qemu_prologue(s);

#ifdef TCG_TARGET_NEED_POOL_LABELS
    /* Allow the prologue to put e.g. guest_base into a pool entry.  */
    {
        int result = tcg_out_pool_finalize(s);
        tcg_debug_assert(result == 0);
    }
#endif

    buf1 = s->code_ptr;
    flush_icache_range((uintptr_t)buf0, (uintptr_t)buf1);

    /* Deduct the prologue from the buffer.  */
    prologue_size = tcg_current_code_size(s);
    s->code_gen_ptr = buf1;
    s->code_gen_buffer = buf1;
    s->code_buf = buf1;
    total_size -= prologue_size;
    s->code_gen_buffer_size = total_size;

    tcg_register_jit(s, s->code_gen_buffer, total_size);

    /* Assert that goto_ptr is implemented completely.  */
    if (TCG_TARGET_HAS_goto_ptr) {
        tcg_debug_assert(s->code_gen_epilogue != NULL);
    }
}